

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to16.h
# Opt level: O0

void ncnn::im2col_sgemm_pack1to16_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m512 _val;
  __m512 _w0_2;
  int j_2;
  __m512 _sum;
  int nn_2;
  float *kptr0_2;
  float *tmpptr_5;
  __m512 _val3_1;
  __m512 _val2_1;
  __m512 _val1_1;
  __m512 _val0_1;
  __m512 _w0_1;
  int j_1;
  __m512 _sum3_1;
  __m512 _sum2_1;
  __m512 _sum1_1;
  __m512 _sum0_1;
  int nn_1;
  float *kptr0_1;
  float *tmpptr_4;
  __m512 _val7;
  __m512 _val6;
  __m512 _val5;
  __m512 _val4;
  __m512 _val3;
  __m512 _val2;
  __m512 _val1;
  __m512 _val0;
  __m512 _w0;
  int j;
  __m512 _sum7;
  __m512 _sum6;
  __m512 _sum5;
  __m512 _sum4;
  __m512 _sum3;
  __m512 _sum2;
  __m512 _sum1;
  __m512 _sum0;
  int nn;
  float *kptr0;
  float *tmpptr_3;
  int i_3;
  float *biasptr;
  float zeros [16];
  float *outptr0;
  int p;
  int k_2;
  float *img0_2;
  int q_2;
  float *tmpptr_2;
  int i_2;
  __m128 _r0_1;
  int k_1;
  float *img0_1;
  int q_1;
  float *tmpptr_1;
  int i_1;
  int ii_1;
  __m256 _r0;
  int k;
  float *img0;
  int q;
  float *tmpptr;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  Mat tmp;
  float *bias;
  int outch;
  int inch;
  int maxk;
  int size;
  Mat *m_11;
  Mat *m_9;
  Mat *m_7;
  Mat *m_6;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_12;
  Mat *m_10;
  Mat *m_8;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  int in_stack_ffffffffffffcd9c;
  size_t in_stack_ffffffffffffcda0;
  void **ppvVar2;
  undefined8 in_stack_ffffffffffffcda8;
  int _h;
  undefined8 in_stack_ffffffffffffcdb0;
  int _w;
  Mat *in_stack_ffffffffffffcdb8;
  Allocator *in_stack_ffffffffffffce18;
  undefined1 (*local_3158) [64];
  int local_2f44;
  undefined1 local_2f40 [64];
  undefined8 local_2ee0;
  undefined8 local_2ed8;
  undefined8 local_2ed0;
  undefined4 local_2ec8;
  long local_2ec0;
  undefined4 local_2eb8;
  undefined4 local_2eb4;
  undefined4 local_2eb0;
  undefined4 local_2eac;
  undefined4 local_2ea8;
  undefined8 local_2ea0;
  undefined1 (*local_2e98) [64];
  undefined8 local_2e90;
  undefined8 local_2e88;
  undefined8 local_2e80;
  undefined4 local_2e78;
  long *local_2e70;
  undefined4 local_2e68;
  undefined4 local_2e64;
  undefined4 local_2e60;
  undefined4 local_2e5c;
  undefined4 local_2e58;
  undefined8 local_2e50;
  uint *local_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 uStack_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 uStack_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 uStack_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 uStack_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 uStack_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  int local_2cc4;
  undefined1 local_2cc0 [64];
  undefined1 local_2c80 [64];
  undefined1 local_2c40 [64];
  undefined1 local_2c00 [64];
  int local_2ba4;
  undefined8 local_2ba0;
  undefined8 local_2b98;
  undefined8 local_2b90;
  undefined4 local_2b88;
  long local_2b80;
  undefined4 local_2b78;
  undefined4 local_2b74;
  undefined4 local_2b70;
  undefined4 local_2b6c;
  undefined4 local_2b68;
  undefined8 local_2b60;
  undefined1 (*local_2b58) [64];
  undefined8 local_2b50;
  undefined8 local_2b48;
  undefined8 local_2b40;
  undefined4 local_2b38;
  long *local_2b30;
  undefined4 local_2b28;
  undefined4 local_2b24;
  undefined4 local_2b20;
  undefined4 local_2b1c;
  undefined4 local_2b18;
  undefined8 local_2b10;
  uint *local_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 uStack_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 uStack_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 uStack_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 uStack_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 uStack_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 uStack_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 uStack_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  int local_2884;
  undefined1 local_2880 [64];
  undefined1 local_2840 [64];
  undefined1 local_2800 [64];
  undefined1 local_27c0 [64];
  undefined1 local_2780 [64];
  undefined1 local_2740 [64];
  undefined1 local_2700 [64];
  undefined1 local_26c0 [64];
  int local_2674;
  undefined8 local_2670;
  undefined8 local_2668;
  undefined8 local_2660;
  undefined4 local_2658;
  long local_2650;
  undefined4 local_2648;
  undefined4 local_2644;
  undefined4 local_2640;
  undefined4 local_263c;
  undefined4 local_2638;
  undefined8 local_2630;
  undefined1 (*local_2628) [64];
  undefined8 local_2620;
  undefined8 local_2618;
  undefined8 local_2610;
  undefined4 local_2608;
  long *local_2600;
  undefined4 local_25f8;
  undefined4 local_25f4;
  undefined4 local_25f0;
  undefined4 local_25ec;
  undefined4 local_25e8;
  undefined8 local_25e0;
  uint *local_25d8;
  int local_25cc;
  undefined1 (*local_25c8) [64];
  undefined1 local_25c0 [72];
  undefined8 local_2578;
  undefined8 local_2570;
  undefined8 local_2568;
  undefined4 local_2560;
  long local_2558;
  undefined4 local_2550;
  undefined4 local_254c;
  undefined4 local_2548;
  undefined4 local_2544;
  undefined4 local_2540;
  undefined8 local_2538;
  undefined8 *local_2530;
  int local_2528;
  int local_2524;
  undefined8 local_2520;
  undefined8 local_2518;
  undefined8 local_2510;
  undefined4 local_2508;
  long local_2500;
  undefined4 local_24f8;
  undefined4 local_24f4;
  undefined4 local_24f0;
  undefined4 local_24ec;
  undefined4 local_24e8;
  undefined8 local_24e0;
  undefined4 *local_24d8;
  int local_24cc;
  undefined8 local_24c8;
  undefined8 local_24c0;
  undefined8 local_24b8;
  undefined4 local_24b0;
  long *local_24a8;
  undefined4 local_24a0;
  undefined4 local_249c;
  undefined4 local_2498;
  undefined4 local_2494;
  undefined4 local_2490;
  undefined8 local_2488;
  undefined4 *local_2480;
  int local_2474;
  undefined8 local_2470;
  undefined8 uStack_2468;
  int local_2454;
  undefined8 local_2450;
  undefined8 local_2448;
  undefined8 local_2440;
  undefined4 local_2438;
  long local_2430;
  undefined4 local_2428;
  undefined4 local_2424;
  undefined4 local_2420;
  undefined4 local_241c;
  undefined4 local_2418;
  undefined8 local_2410;
  undefined1 (*local_2408) [16];
  int local_23fc;
  undefined8 local_23f8;
  undefined8 local_23f0;
  undefined8 local_23e8;
  undefined4 local_23e0;
  long *local_23d8;
  undefined4 local_23d0;
  undefined4 local_23cc;
  undefined4 local_23c8;
  undefined4 local_23c4;
  undefined4 local_23c0;
  undefined8 local_23b8;
  undefined1 (*local_23b0) [16];
  int local_23a8;
  int local_23a4;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  int local_237c;
  undefined8 local_2378;
  undefined8 local_2370;
  undefined8 local_2368;
  undefined4 local_2360;
  long local_2358;
  undefined4 local_2350;
  undefined4 local_234c;
  undefined4 local_2348;
  undefined4 local_2344;
  undefined4 local_2340;
  undefined8 local_2338;
  undefined1 (*local_2330) [32];
  int local_2324;
  undefined8 local_2320;
  undefined8 local_2318;
  undefined8 local_2310;
  undefined4 local_2308;
  long *local_2300;
  undefined4 local_22f8;
  undefined4 local_22f4;
  undefined4 local_22f0;
  undefined4 local_22ec;
  undefined4 local_22e8;
  undefined8 local_22e0;
  undefined1 (*local_22d8) [32];
  int local_22cc;
  int local_22c8;
  int local_22c4;
  int local_22c0;
  void *local_22b0;
  int *local_22a8;
  long local_22a0;
  undefined4 local_2298;
  long *local_2290;
  undefined4 local_2288;
  int local_2284;
  int local_2280;
  undefined4 local_227c;
  undefined4 local_2278;
  long local_2270;
  long local_2268;
  int local_2260;
  int local_225c;
  int local_2258;
  int local_2254;
  long *local_2240;
  long *local_2238;
  long *local_2230;
  void **local_2228;
  undefined8 *local_2220;
  undefined8 *local_2210;
  undefined8 *local_2200;
  undefined8 *local_21f0;
  undefined8 *local_21e0;
  undefined8 *local_21d0;
  undefined8 *local_21c0;
  undefined8 *local_21b0;
  undefined8 *local_21a0;
  undefined8 *local_2190;
  undefined8 *local_2180;
  undefined8 *local_2170;
  undefined8 *local_2160;
  void **local_2150;
  int local_2130;
  undefined4 local_212c;
  void **local_2128;
  undefined8 *local_2108;
  undefined8 *local_20e8;
  undefined8 *local_20c8;
  undefined8 *local_20a8;
  undefined8 *local_2088;
  undefined8 *local_2068;
  undefined8 *local_2048;
  undefined8 *local_2028;
  undefined8 *local_2008;
  undefined8 *local_1fe8;
  undefined8 *local_1fc8;
  undefined8 *local_1fa8;
  undefined8 *local_1f88;
  undefined1 local_1f7d;
  int local_1f7c;
  void **local_1f78;
  undefined8 *local_1f70;
  undefined1 local_1f4d;
  int local_1f4c;
  void **local_1f48;
  undefined8 *local_1f40;
  undefined1 local_1f1d;
  int local_1f1c;
  void **local_1f18;
  undefined8 *local_1f10;
  undefined1 local_1eed;
  int local_1eec;
  undefined8 *local_1ee0;
  undefined1 local_1ebd;
  int local_1ebc;
  void **local_1eb8;
  undefined8 *local_1eb0;
  undefined1 local_1e8d;
  int local_1e8c;
  void **local_1e88;
  undefined8 *local_1e80;
  undefined1 local_1e5d;
  int local_1e5c;
  void **local_1e58;
  undefined8 *local_1e50;
  undefined8 *local_1e30;
  undefined8 *local_1e28;
  undefined8 *local_1e20;
  undefined8 *local_1e18;
  undefined8 *local_1e10;
  undefined8 *local_1e08;
  undefined8 *local_1e00;
  undefined8 *local_1df8;
  undefined8 *local_1df0;
  undefined8 *local_1de8;
  undefined1 local_1dd5;
  int local_1dd4;
  undefined8 *local_1dc8;
  undefined1 local_1da5;
  int local_1da4;
  undefined8 *local_1d98;
  undefined1 local_1d75;
  int local_1d74;
  undefined8 *local_1d68;
  undefined1 local_1d45;
  int local_1d44;
  undefined8 *local_1d38;
  undefined1 local_1d15;
  int local_1d14;
  undefined8 *local_1d08;
  undefined1 local_1ce5;
  int local_1ce4;
  undefined8 *local_1cd8;
  undefined8 *local_1cb8;
  undefined8 *local_1cb0;
  undefined8 *local_1ca8;
  void *local_1b68;
  undefined1 (*local_1b58) [64];
  undefined1 (*local_1b50) [64];
  undefined1 (*local_1b48) [64];
  undefined1 local_1b40 [64];
  uint local_1ac4;
  undefined1 local_1ac0 [64];
  uint local_1a44;
  undefined1 local_1a40 [64];
  uint local_19c4;
  undefined1 local_19c0 [64];
  uint local_1944;
  undefined1 local_1940 [64];
  uint local_18c4;
  undefined1 local_18c0 [64];
  uint local_1844;
  undefined1 local_1840 [64];
  uint local_17c4;
  undefined1 local_17c0 [64];
  uint local_1744;
  undefined1 local_1740 [64];
  uint local_16c4;
  undefined1 local_16c0 [64];
  uint local_1644;
  undefined1 local_1640 [64];
  uint local_15c4;
  undefined1 local_15c0 [64];
  uint local_1544;
  undefined1 local_1540 [64];
  uint local_14c4;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 uStack_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 uStack_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 uStack_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 uStack_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 uStack_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 uStack_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 uStack_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 uStack_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 (*local_ad8) [64];
  undefined1 (*local_ad0) [64];
  undefined1 (*local_ac8) [64];
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 *local_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 *local_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 *local_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 *local_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 *local_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 *local_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 *local_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 *local_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 *local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 *local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 (*local_430) [32];
  undefined1 (*local_428) [32];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 (*local_408) [16];
  undefined1 (*local_400) [16];
  long local_3f8;
  undefined4 local_3ec;
  long local_3e8;
  long local_3e0;
  undefined4 local_3d4;
  int local_3d0;
  int local_3cc;
  undefined8 *local_3c8;
  long local_3c0;
  undefined4 local_3b4;
  long local_3b0;
  long local_3a8;
  undefined4 local_39c;
  int local_398;
  int local_394;
  undefined8 *local_390;
  long local_388;
  undefined4 local_37c;
  long local_378;
  long local_370;
  undefined4 local_364;
  int local_360;
  int local_35c;
  undefined8 *local_358;
  long local_350;
  undefined4 local_344;
  long local_340;
  undefined1 (*local_338) [64];
  undefined4 local_32c;
  int local_328;
  int local_324;
  undefined8 *local_320;
  long local_318;
  undefined4 local_30c;
  long local_308;
  undefined1 (*local_300) [64];
  undefined4 local_2f4;
  int local_2f0;
  int local_2ec;
  undefined8 *local_2e8;
  long local_2e0;
  undefined4 local_2d4;
  long local_2d0;
  undefined1 (*local_2c8) [64];
  undefined4 local_2bc;
  int local_2b8;
  int local_2b4;
  undefined8 *local_2b0;
  long *local_2a8;
  undefined4 local_29c;
  long local_298;
  undefined1 (*local_290) [32];
  undefined4 local_284;
  int local_280;
  int local_27c;
  undefined8 *local_278;
  long *local_270;
  undefined4 local_264;
  long local_260;
  undefined1 (*local_258) [16];
  undefined4 local_24c;
  int local_248;
  int local_244;
  undefined8 *local_240;
  long *local_238;
  undefined4 local_22c;
  long local_228;
  undefined4 *local_220;
  undefined4 local_214;
  int local_210;
  int local_20c;
  undefined8 *local_208;
  long local_200;
  undefined4 local_1f4;
  long local_1f0;
  undefined8 *local_1e8;
  undefined4 local_1dc;
  int local_1d8;
  int local_1d4;
  undefined8 *local_1d0;
  long *local_1c8;
  undefined4 local_1bc;
  long local_1b8;
  uint *local_1b0;
  undefined4 local_1a4;
  int local_1a0;
  int local_19c;
  undefined8 *local_198;
  long *local_190;
  undefined4 local_184;
  long local_180;
  uint *local_178;
  undefined4 local_16c;
  int local_168;
  int local_164;
  undefined8 *local_160;
  long *local_158;
  undefined4 local_14c;
  long local_148;
  uint *local_140;
  undefined4 local_134;
  int local_130;
  int local_12c;
  undefined8 *local_128;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  
  local_2254 = *(int *)((long)in_RDI + 0x2c);
  local_2258 = (int)in_RDI[6];
  local_225c = (int)in_RDI[7];
  local_2260 = (int)in_RSI[7];
  local_2268 = *in_RCX;
  local_2228 = &local_22b0;
  local_22b0 = (void *)0x0;
  local_22a8 = (int *)0x0;
  local_22a0 = 0;
  local_2298 = 0;
  local_2290 = (long *)0x0;
  local_2288 = 0;
  local_2284 = 0;
  local_2280 = 0;
  local_227c = 0;
  local_2278 = 0;
  local_2270 = 0;
  _h = (int)in_stack_ffffffffffffcdb0;
  _w = (int)((ulong)in_stack_ffffffffffffcdb0 >> 0x20);
  iVar1 = (int)((ulong)in_stack_ffffffffffffcda8 >> 0x20);
  local_2240 = in_RDX;
  local_2238 = in_RSI;
  local_2230 = in_RDI;
  if (local_2254 < 8) {
    if (local_2254 < 4) {
      Mat::create(in_stack_ffffffffffffcdb8,_w,_h,iVar1,in_stack_ffffffffffffcda0,
                  in_stack_ffffffffffffcd9c,in_stack_ffffffffffffce18);
    }
    else {
      Mat::create(in_stack_ffffffffffffcdb8,_w,_h,iVar1,in_stack_ffffffffffffcda0,
                  in_stack_ffffffffffffcd9c,in_stack_ffffffffffffce18);
    }
  }
  else {
    Mat::create(in_stack_ffffffffffffcdb8,_w,_h,iVar1,in_stack_ffffffffffffcda0,
                in_stack_ffffffffffffcd9c,in_stack_ffffffffffffce18);
  }
  iVar1 = local_2254 >> 3;
  for (local_22c8 = 0; local_22c8 < iVar1; local_22c8 = local_22c8 + 1) {
    local_22cc = local_22c8 * 8;
    local_1e5c = local_22cc / 8;
    local_1e50 = &local_2320;
    local_1e58 = &local_22b0;
    local_290 = (undefined1 (*) [32])((long)local_22b0 + local_2270 * local_1e5c * local_22a0);
    local_278 = &local_2320;
    local_b8 = (long)local_2284 * (long)local_2280 * local_22a0;
    local_1e18 = &local_2320;
    local_2220 = &local_2320;
    local_2300 = local_2290;
    local_bc = 0x10;
    local_27c = local_2284;
    local_280 = local_2280;
    local_284 = local_227c;
    local_298 = local_22a0;
    local_29c = local_2298;
    local_2a8 = local_2290;
    local_1e5d = 1;
    local_2320 = 0;
    local_2310 = 0;
    local_2308 = 0;
    local_22f8 = 0;
    local_22f4 = 0;
    local_22f0 = 0;
    local_22ec = 0;
    local_22e8 = 0;
    local_22e0 = 0;
    local_2318 = 0;
    local_22d8 = local_290;
    for (local_2324 = 0; local_2324 < local_225c; local_2324 = local_2324 + 1) {
      local_1cd8 = &local_2378;
      local_3cc = *(int *)((long)local_2230 + 0x2c);
      local_3d0 = (int)local_2230[6];
      local_3d4 = *(undefined4 *)((long)local_2230 + 0x34);
      local_3e0 = *local_2230 + local_2230[8] * (long)local_2324 * local_2230[2];
      local_3e8 = local_2230[2];
      local_3ec = (undefined4)local_2230[3];
      local_3f8 = local_2230[4];
      local_3c8 = &local_2378;
      local_58 = (long)local_3cc * (long)local_3d0 * local_3e8;
      local_1de8 = &local_2378;
      local_2330 = (undefined1 (*) [32])(local_3e0 + (long)local_22cc * 4);
      local_2210 = &local_2378;
      local_5c = 0x10;
      local_1ce4 = local_2324;
      local_1ce5 = 1;
      local_2378 = 0;
      local_2368 = 0;
      local_2360 = 0;
      local_2350 = 0;
      local_234c = 0;
      local_2348 = 0;
      local_2344 = 0;
      local_2340 = 0;
      local_2338 = 0;
      local_2370 = 0;
      for (local_237c = 0; local_237c < local_2258; local_237c = local_237c + 1) {
        local_428 = local_2330;
        local_23a0 = *(undefined8 *)*local_2330;
        uStack_2398 = *(undefined8 *)(*local_2330 + 8);
        uStack_2390 = *(undefined8 *)(*local_2330 + 0x10);
        uStack_2388 = *(undefined8 *)(*local_2330 + 0x18);
        local_430 = local_22d8;
        *local_22d8 = *local_2330;
        local_2330 = (undefined1 (*) [32])(*local_2330 + (long)local_2254 * 4);
        local_22d8 = local_22d8 + 1;
        local_460 = local_23a0;
        uStack_458 = uStack_2398;
        uStack_450 = uStack_2390;
        uStack_448 = uStack_2388;
      }
      local_1fa8 = local_2210;
      local_2358 = local_3f8;
    }
    local_1f88 = local_2220;
  }
  local_22c0 = local_2254 + iVar1 * -8 >> 2;
  for (local_23a4 = 0; local_23a4 < local_22c0; local_23a4 = local_23a4 + 1) {
    local_23a8 = iVar1 * 8 + local_23a4 * 4;
    local_1e8c = local_23a8 / 8 +
                 (int)((long)((ulong)(uint)((int)((long)local_23a8 % 8) >> 0x1f) << 0x20 |
                             (long)local_23a8 % 8 & 0xffffffffU) / 4);
    local_1e80 = &local_23f8;
    local_1e88 = &local_22b0;
    local_258 = (undefined1 (*) [16])((long)local_22b0 + local_2270 * local_1e8c * local_22a0);
    local_240 = &local_23f8;
    local_c8 = (long)local_2284 * (long)local_2280 * local_22a0;
    local_1e20 = &local_23f8;
    local_2200 = &local_23f8;
    local_23d8 = local_2290;
    local_cc = 0x10;
    local_244 = local_2284;
    local_248 = local_2280;
    local_24c = local_227c;
    local_260 = local_22a0;
    local_264 = local_2298;
    local_270 = local_2290;
    local_1e8d = 1;
    local_23f8 = 0;
    local_23e8 = 0;
    local_23e0 = 0;
    local_23d0 = 0;
    local_23cc = 0;
    local_23c8 = 0;
    local_23c4 = 0;
    local_23c0 = 0;
    local_23b8 = 0;
    local_23f0 = 0;
    local_23b0 = local_258;
    for (local_23fc = 0; local_23fc < local_225c; local_23fc = local_23fc + 1) {
      local_1d08 = &local_2450;
      local_394 = *(int *)((long)local_2230 + 0x2c);
      local_398 = (int)local_2230[6];
      local_39c = *(undefined4 *)((long)local_2230 + 0x34);
      local_3a8 = *local_2230 + local_2230[8] * (long)local_23fc * local_2230[2];
      local_3b0 = local_2230[2];
      local_3b4 = (undefined4)local_2230[3];
      local_3c0 = local_2230[4];
      local_390 = &local_2450;
      local_68 = (long)local_394 * (long)local_398 * local_3b0;
      local_1df0 = &local_2450;
      local_2408 = (undefined1 (*) [16])(local_3a8 + (long)local_23a8 * 4);
      local_21f0 = &local_2450;
      local_6c = 0x10;
      local_1d14 = local_23fc;
      local_1d15 = 1;
      local_2450 = 0;
      local_2440 = 0;
      local_2438 = 0;
      local_2428 = 0;
      local_2424 = 0;
      local_2420 = 0;
      local_241c = 0;
      local_2418 = 0;
      local_2410 = 0;
      local_2448 = 0;
      for (local_2454 = 0; local_2454 < local_2258; local_2454 = local_2454 + 1) {
        local_400 = local_2408;
        local_2470 = *(undefined8 *)*local_2408;
        uStack_2468 = *(undefined8 *)(*local_2408 + 8);
        local_408 = local_23b0;
        *local_23b0 = *local_2408;
        local_2408 = (undefined1 (*) [16])(*local_2408 + (long)local_2254 * 4);
        local_23b0 = local_23b0 + 1;
        local_420 = local_2470;
        uStack_418 = uStack_2468;
      }
      local_1fe8 = local_21f0;
      local_2430 = local_3c0;
    }
    local_1fc8 = local_2200;
  }
  local_22c4 = local_22c0 * 4 + iVar1 * 8;
  for (local_2474 = local_22c4; local_2474 < local_2254; local_2474 = local_2474 + 1) {
    local_1ebc = local_2474 / 8 +
                 (int)((long)((ulong)(uint)((int)((long)local_2474 % 8) >> 0x1f) << 0x20 |
                             (long)local_2474 % 8 & 0xffffffffU) / 4) + local_2474 % 4;
    local_1eb0 = &local_24c8;
    local_1eb8 = &local_22b0;
    local_220 = (undefined4 *)((long)local_22b0 + local_2270 * local_1ebc * local_22a0);
    local_208 = &local_24c8;
    local_d8 = (long)local_2284 * (long)local_2280 * local_22a0;
    local_1e28 = &local_24c8;
    local_21e0 = &local_24c8;
    local_24a8 = local_2290;
    local_dc = 0x10;
    local_20c = local_2284;
    local_210 = local_2280;
    local_214 = local_227c;
    local_228 = local_22a0;
    local_22c = local_2298;
    local_238 = local_2290;
    local_1ebd = 1;
    local_24c8 = 0;
    local_24b8 = 0;
    local_24b0 = 0;
    local_24a0 = 0;
    local_249c = 0;
    local_2498 = 0;
    local_2494 = 0;
    local_2490 = 0;
    local_2488 = 0;
    local_24c0 = 0;
    local_2480 = local_220;
    for (local_24cc = 0; local_24cc < local_225c; local_24cc = local_24cc + 1) {
      local_1d38 = &local_2520;
      local_35c = *(int *)((long)local_2230 + 0x2c);
      local_360 = (int)local_2230[6];
      local_364 = *(undefined4 *)((long)local_2230 + 0x34);
      local_370 = *local_2230 + local_2230[8] * (long)local_24cc * local_2230[2];
      local_378 = local_2230[2];
      local_37c = (undefined4)local_2230[3];
      local_388 = local_2230[4];
      local_358 = &local_2520;
      local_78 = (long)local_35c * (long)local_360 * local_378;
      local_1df8 = &local_2520;
      local_24d8 = (undefined4 *)(local_370 + (long)local_2474 * 4);
      local_21d0 = &local_2520;
      local_7c = 0x10;
      local_1d44 = local_24cc;
      local_1d45 = 1;
      local_2520 = 0;
      local_2510 = 0;
      local_2508 = 0;
      local_24f8 = 0;
      local_24f4 = 0;
      local_24f0 = 0;
      local_24ec = 0;
      local_24e8 = 0;
      local_24e0 = 0;
      local_2518 = 0;
      for (local_2524 = 0; local_2524 < local_2258; local_2524 = local_2524 + 1) {
        *local_2480 = *local_24d8;
        local_24d8 = local_24d8 + local_2254;
        local_2480 = local_2480 + 1;
      }
      local_2028 = local_21d0;
      local_2500 = local_388;
    }
    local_2008 = local_21e0;
  }
  for (local_2528 = 0; local_2528 < local_2260; local_2528 = local_2528 + 1) {
    local_1ee0 = &local_2578;
    local_1d4 = *(int *)((long)local_2238 + 0x2c);
    local_1d8 = (int)local_2238[6];
    local_1dc = *(undefined4 *)((long)local_2238 + 0x34);
    local_2530 = (undefined8 *)(*local_2238 + local_2238[8] * (long)local_2528 * local_2238[2]);
    local_1f0 = local_2238[2];
    local_1f4 = (undefined4)local_2238[3];
    local_200 = local_2238[4];
    local_1d0 = &local_2578;
    local_e8 = (long)local_1d4 * (long)local_1d8 * local_1f0;
    local_1e30 = &local_2578;
    local_21c0 = &local_2578;
    local_ec = 0x10;
    local_1eec = local_2528;
    local_1eed = 1;
    local_2578 = 0;
    local_2568 = 0;
    local_2560 = 0;
    local_2550 = 0;
    local_254c = 0;
    local_2548 = 0;
    local_2544 = 0;
    local_2540 = 0;
    local_2538 = 0;
    local_2570 = 0;
    local_2048 = local_21c0;
    local_1e8 = local_2530;
    local_2558 = local_200;
    memset(local_25c0,0,0x40);
    if (local_2268 == 0) {
      local_3158 = (undefined1 (*) [64])local_25c0;
    }
    else {
      local_3158 = (undefined1 (*) [64])(local_2268 + (long)(local_2528 << 4) * 4);
    }
    local_25c8 = local_3158;
    for (local_25cc = 0; local_25cc + 7 < local_2254; local_25cc = local_25cc + 8) {
      local_1f1c = local_25cc / 8;
      local_1f10 = &local_2620;
      local_1f18 = &local_22b0;
      local_1b0 = (uint *)((long)local_22b0 + local_2270 * local_1f1c * local_22a0);
      local_198 = &local_2620;
      local_f8 = (long)local_2284 * (long)local_2280 * local_22a0;
      local_1ca8 = &local_2620;
      local_21b0 = &local_2620;
      local_2600 = local_2290;
      local_fc = 0x10;
      local_19c = local_2284;
      local_1a0 = local_2280;
      local_1a4 = local_227c;
      local_1b8 = local_22a0;
      local_1bc = local_2298;
      local_1c8 = local_2290;
      local_1f1d = 1;
      local_2620 = 0;
      local_2610 = 0;
      local_2608 = 0;
      local_25f4 = 0;
      local_25f0 = 0;
      local_25ec = 0;
      local_25e8 = 0;
      local_2618 = 0;
      local_1d68 = &local_2670;
      local_324 = *(int *)((long)local_2240 + 0x2c);
      local_328 = (int)local_2240[6];
      local_32c = *(undefined4 *)((long)local_2240 + 0x34);
      local_338 = (undefined1 (*) [64])
                  (*local_2240 + local_2240[8] * (long)local_2528 * local_2240[2]);
      local_340 = local_2240[2];
      local_344 = (undefined4)local_2240[3];
      local_350 = local_2240[4];
      local_320 = &local_2670;
      local_88 = (long)local_324 * (long)local_328 * local_340;
      local_8c = 0x10;
      local_1d74 = local_2528;
      local_1d75 = 1;
      local_25e0 = 0;
      local_25f8 = 0;
      local_1e00 = &local_2670;
      local_21a0 = &local_2670;
      local_2670 = 0;
      local_2660 = 0;
      local_2658 = 0;
      local_2648 = 0;
      local_2644 = 0;
      local_2640 = 0;
      local_263c = 0;
      local_2638 = 0;
      local_2630 = 0;
      local_2668 = 0;
      local_2674 = local_225c * local_2258;
      local_1b48 = local_3158;
      local_2700 = *local_3158;
      local_2880 = *local_3158;
      local_2840 = *local_3158;
      local_2800 = *local_3158;
      local_27c0 = *local_3158;
      local_2780 = *local_3158;
      local_2740 = *local_3158;
      local_26c0 = *local_3158;
      local_2884 = 0;
      local_2628 = local_338;
      local_25d8 = local_1b0;
      while( true ) {
        if (local_2674 <= local_2884) break;
        local_ac8 = local_2628;
        local_2900 = *(undefined8 *)*local_2628;
        uStack_28f8 = *(undefined8 *)(*local_2628 + 8);
        uStack_28f0 = *(undefined8 *)(*local_2628 + 0x10);
        uStack_28e8 = *(undefined8 *)(*local_2628 + 0x18);
        uStack_28e0 = *(undefined8 *)(*local_2628 + 0x20);
        uStack_28d8 = *(undefined8 *)(*local_2628 + 0x28);
        uStack_28d0 = *(undefined8 *)(*local_2628 + 0x30);
        uStack_28c8 = *(undefined8 *)(*local_2628 + 0x38);
        local_14c4 = *local_25d8;
        local_1540 = vbroadcastss_avx512f(ZEXT416(local_14c4));
        local_2940 = local_1540._0_8_;
        uStack_2938 = local_1540._8_8_;
        uStack_2930 = local_1540._16_8_;
        uStack_2928 = local_1540._24_8_;
        uStack_2920 = local_1540._32_8_;
        uStack_2918 = local_1540._40_8_;
        uStack_2910 = local_1540._48_8_;
        uStack_2908 = local_1540._56_8_;
        local_1544 = local_25d8[1];
        local_15c0 = vbroadcastss_avx512f(ZEXT416(local_1544));
        local_2980 = local_15c0._0_8_;
        uStack_2978 = local_15c0._8_8_;
        uStack_2970 = local_15c0._16_8_;
        uStack_2968 = local_15c0._24_8_;
        uStack_2960 = local_15c0._32_8_;
        uStack_2958 = local_15c0._40_8_;
        uStack_2950 = local_15c0._48_8_;
        uStack_2948 = local_15c0._56_8_;
        local_15c4 = local_25d8[2];
        local_1640 = vbroadcastss_avx512f(ZEXT416(local_15c4));
        local_29c0 = local_1640._0_8_;
        uStack_29b8 = local_1640._8_8_;
        uStack_29b0 = local_1640._16_8_;
        uStack_29a8 = local_1640._24_8_;
        uStack_29a0 = local_1640._32_8_;
        uStack_2998 = local_1640._40_8_;
        uStack_2990 = local_1640._48_8_;
        uStack_2988 = local_1640._56_8_;
        local_1644 = local_25d8[3];
        local_16c0 = vbroadcastss_avx512f(ZEXT416(local_1644));
        local_2a00 = local_16c0._0_8_;
        uStack_29f8 = local_16c0._8_8_;
        uStack_29f0 = local_16c0._16_8_;
        uStack_29e8 = local_16c0._24_8_;
        uStack_29e0 = local_16c0._32_8_;
        uStack_29d8 = local_16c0._40_8_;
        uStack_29d0 = local_16c0._48_8_;
        uStack_29c8 = local_16c0._56_8_;
        local_16c4 = local_25d8[4];
        local_1740 = vbroadcastss_avx512f(ZEXT416(local_16c4));
        local_2a40 = local_1740._0_8_;
        uStack_2a38 = local_1740._8_8_;
        uStack_2a30 = local_1740._16_8_;
        uStack_2a28 = local_1740._24_8_;
        uStack_2a20 = local_1740._32_8_;
        uStack_2a18 = local_1740._40_8_;
        uStack_2a10 = local_1740._48_8_;
        uStack_2a08 = local_1740._56_8_;
        local_1744 = local_25d8[5];
        local_17c0 = vbroadcastss_avx512f(ZEXT416(local_1744));
        local_2a80 = local_17c0._0_8_;
        uStack_2a78 = local_17c0._8_8_;
        uStack_2a70 = local_17c0._16_8_;
        uStack_2a68 = local_17c0._24_8_;
        uStack_2a60 = local_17c0._32_8_;
        uStack_2a58 = local_17c0._40_8_;
        uStack_2a50 = local_17c0._48_8_;
        uStack_2a48 = local_17c0._56_8_;
        local_17c4 = local_25d8[6];
        local_1840 = vbroadcastss_avx512f(ZEXT416(local_17c4));
        local_2ac0 = local_1840._0_8_;
        uStack_2ab8 = local_1840._8_8_;
        uStack_2ab0 = local_1840._16_8_;
        uStack_2aa8 = local_1840._24_8_;
        uStack_2aa0 = local_1840._32_8_;
        uStack_2a98 = local_1840._40_8_;
        uStack_2a90 = local_1840._48_8_;
        uStack_2a88 = local_1840._56_8_;
        local_1844 = local_25d8[7];
        local_18c0 = vbroadcastss_avx512f(ZEXT416(local_1844));
        local_2b00 = local_18c0._0_8_;
        uStack_2af8 = local_18c0._8_8_;
        uStack_2af0 = local_18c0._16_8_;
        uStack_2ae8 = local_18c0._24_8_;
        uStack_2ae0 = local_18c0._32_8_;
        uStack_2ad8 = local_18c0._40_8_;
        uStack_2ad0 = local_18c0._48_8_;
        uStack_2ac8 = local_18c0._56_8_;
        local_b40 = local_1540._0_8_;
        uStack_b38 = local_1540._8_8_;
        uStack_b30 = local_1540._16_8_;
        uStack_b28 = local_1540._24_8_;
        uStack_b20 = local_1540._32_8_;
        uStack_b18 = local_1540._40_8_;
        uStack_b10 = local_1540._48_8_;
        uStack_b08 = local_1540._56_8_;
        local_bc0 = local_26c0._0_8_;
        uStack_bb8 = local_26c0._8_8_;
        uStack_bb0 = local_26c0._16_8_;
        uStack_ba8 = local_26c0._24_8_;
        uStack_ba0 = local_26c0._32_8_;
        uStack_b98 = local_26c0._40_8_;
        uStack_b90 = local_26c0._48_8_;
        uStack_b88 = local_26c0._56_8_;
        local_26c0 = vfmadd213ps_avx512f(*local_2628,local_1540,local_26c0);
        local_c00 = local_15c0._0_8_;
        uStack_bf8 = local_15c0._8_8_;
        uStack_bf0 = local_15c0._16_8_;
        uStack_be8 = local_15c0._24_8_;
        uStack_be0 = local_15c0._32_8_;
        uStack_bd8 = local_15c0._40_8_;
        uStack_bd0 = local_15c0._48_8_;
        uStack_bc8 = local_15c0._56_8_;
        local_c80 = local_2700._0_8_;
        uStack_c78 = local_2700._8_8_;
        uStack_c70 = local_2700._16_8_;
        uStack_c68 = local_2700._24_8_;
        uStack_c60 = local_2700._32_8_;
        uStack_c58 = local_2700._40_8_;
        uStack_c50 = local_2700._48_8_;
        uStack_c48 = local_2700._56_8_;
        local_2700 = vfmadd213ps_avx512f(*local_2628,local_15c0,local_2700);
        local_cc0 = local_1640._0_8_;
        uStack_cb8 = local_1640._8_8_;
        uStack_cb0 = local_1640._16_8_;
        uStack_ca8 = local_1640._24_8_;
        uStack_ca0 = local_1640._32_8_;
        uStack_c98 = local_1640._40_8_;
        uStack_c90 = local_1640._48_8_;
        uStack_c88 = local_1640._56_8_;
        local_d40 = local_2740._0_8_;
        uStack_d38 = local_2740._8_8_;
        uStack_d30 = local_2740._16_8_;
        uStack_d28 = local_2740._24_8_;
        uStack_d20 = local_2740._32_8_;
        uStack_d18 = local_2740._40_8_;
        uStack_d10 = local_2740._48_8_;
        uStack_d08 = local_2740._56_8_;
        local_2740 = vfmadd213ps_avx512f(*local_2628,local_1640,local_2740);
        local_d80 = local_16c0._0_8_;
        uStack_d78 = local_16c0._8_8_;
        uStack_d70 = local_16c0._16_8_;
        uStack_d68 = local_16c0._24_8_;
        uStack_d60 = local_16c0._32_8_;
        uStack_d58 = local_16c0._40_8_;
        uStack_d50 = local_16c0._48_8_;
        uStack_d48 = local_16c0._56_8_;
        local_e00 = local_2780._0_8_;
        uStack_df8 = local_2780._8_8_;
        uStack_df0 = local_2780._16_8_;
        uStack_de8 = local_2780._24_8_;
        uStack_de0 = local_2780._32_8_;
        uStack_dd8 = local_2780._40_8_;
        uStack_dd0 = local_2780._48_8_;
        uStack_dc8 = local_2780._56_8_;
        local_2780 = vfmadd213ps_avx512f(*local_2628,local_16c0,local_2780);
        local_e40 = local_1740._0_8_;
        uStack_e38 = local_1740._8_8_;
        uStack_e30 = local_1740._16_8_;
        uStack_e28 = local_1740._24_8_;
        uStack_e20 = local_1740._32_8_;
        uStack_e18 = local_1740._40_8_;
        uStack_e10 = local_1740._48_8_;
        uStack_e08 = local_1740._56_8_;
        local_ec0 = local_27c0._0_8_;
        uStack_eb8 = local_27c0._8_8_;
        uStack_eb0 = local_27c0._16_8_;
        uStack_ea8 = local_27c0._24_8_;
        uStack_ea0 = local_27c0._32_8_;
        uStack_e98 = local_27c0._40_8_;
        uStack_e90 = local_27c0._48_8_;
        uStack_e88 = local_27c0._56_8_;
        local_27c0 = vfmadd213ps_avx512f(*local_2628,local_1740,local_27c0);
        local_f00 = local_17c0._0_8_;
        uStack_ef8 = local_17c0._8_8_;
        uStack_ef0 = local_17c0._16_8_;
        uStack_ee8 = local_17c0._24_8_;
        uStack_ee0 = local_17c0._32_8_;
        uStack_ed8 = local_17c0._40_8_;
        uStack_ed0 = local_17c0._48_8_;
        uStack_ec8 = local_17c0._56_8_;
        local_f80 = local_2800._0_8_;
        uStack_f78 = local_2800._8_8_;
        uStack_f70 = local_2800._16_8_;
        uStack_f68 = local_2800._24_8_;
        uStack_f60 = local_2800._32_8_;
        uStack_f58 = local_2800._40_8_;
        uStack_f50 = local_2800._48_8_;
        uStack_f48 = local_2800._56_8_;
        local_2800 = vfmadd213ps_avx512f(*local_2628,local_17c0,local_2800);
        local_fc0 = local_1840._0_8_;
        uStack_fb8 = local_1840._8_8_;
        uStack_fb0 = local_1840._16_8_;
        uStack_fa8 = local_1840._24_8_;
        uStack_fa0 = local_1840._32_8_;
        uStack_f98 = local_1840._40_8_;
        uStack_f90 = local_1840._48_8_;
        uStack_f88 = local_1840._56_8_;
        local_1040 = local_2840._0_8_;
        uStack_1038 = local_2840._8_8_;
        uStack_1030 = local_2840._16_8_;
        uStack_1028 = local_2840._24_8_;
        uStack_1020 = local_2840._32_8_;
        uStack_1018 = local_2840._40_8_;
        uStack_1010 = local_2840._48_8_;
        uStack_1008 = local_2840._56_8_;
        local_2840 = vfmadd213ps_avx512f(*local_2628,local_1840,local_2840);
        local_1080 = local_18c0._0_8_;
        uStack_1078 = local_18c0._8_8_;
        uStack_1070 = local_18c0._16_8_;
        uStack_1068 = local_18c0._24_8_;
        uStack_1060 = local_18c0._32_8_;
        uStack_1058 = local_18c0._40_8_;
        uStack_1050 = local_18c0._48_8_;
        uStack_1048 = local_18c0._56_8_;
        local_1100 = local_2880._0_8_;
        uStack_10f8 = local_2880._8_8_;
        uStack_10f0 = local_2880._16_8_;
        uStack_10e8 = local_2880._24_8_;
        uStack_10e0 = local_2880._32_8_;
        uStack_10d8 = local_2880._40_8_;
        uStack_10d0 = local_2880._48_8_;
        uStack_10c8 = local_2880._56_8_;
        local_2880 = vfmadd213ps_avx512f(*local_2628,local_18c0,local_2880);
        local_25d8 = local_25d8 + 8;
        local_2628 = local_2628 + 1;
        local_2884 = local_2884 + 1;
        local_10c0 = local_2900;
        uStack_10b8 = uStack_28f8;
        uStack_10b0 = uStack_28f0;
        uStack_10a8 = uStack_28e8;
        uStack_10a0 = uStack_28e0;
        uStack_1098 = uStack_28d8;
        uStack_1090 = uStack_28d0;
        uStack_1088 = uStack_28c8;
        local_1000 = local_2900;
        uStack_ff8 = uStack_28f8;
        uStack_ff0 = uStack_28f0;
        uStack_fe8 = uStack_28e8;
        uStack_fe0 = uStack_28e0;
        uStack_fd8 = uStack_28d8;
        uStack_fd0 = uStack_28d0;
        uStack_fc8 = uStack_28c8;
        local_f40 = local_2900;
        uStack_f38 = uStack_28f8;
        uStack_f30 = uStack_28f0;
        uStack_f28 = uStack_28e8;
        uStack_f20 = uStack_28e0;
        uStack_f18 = uStack_28d8;
        uStack_f10 = uStack_28d0;
        uStack_f08 = uStack_28c8;
        local_e80 = local_2900;
        uStack_e78 = uStack_28f8;
        uStack_e70 = uStack_28f0;
        uStack_e68 = uStack_28e8;
        uStack_e60 = uStack_28e0;
        uStack_e58 = uStack_28d8;
        uStack_e50 = uStack_28d0;
        uStack_e48 = uStack_28c8;
        local_dc0 = local_2900;
        uStack_db8 = uStack_28f8;
        uStack_db0 = uStack_28f0;
        uStack_da8 = uStack_28e8;
        uStack_da0 = uStack_28e0;
        uStack_d98 = uStack_28d8;
        uStack_d90 = uStack_28d0;
        uStack_d88 = uStack_28c8;
        local_d00 = local_2900;
        uStack_cf8 = uStack_28f8;
        uStack_cf0 = uStack_28f0;
        uStack_ce8 = uStack_28e8;
        uStack_ce0 = uStack_28e0;
        uStack_cd8 = uStack_28d8;
        uStack_cd0 = uStack_28d0;
        uStack_cc8 = uStack_28c8;
        local_c40 = local_2900;
        uStack_c38 = uStack_28f8;
        uStack_c30 = uStack_28f0;
        uStack_c28 = uStack_28e8;
        uStack_c20 = uStack_28e0;
        uStack_c18 = uStack_28d8;
        uStack_c10 = uStack_28d0;
        uStack_c08 = uStack_28c8;
        local_b80 = local_2900;
        uStack_b78 = uStack_28f8;
        uStack_b70 = uStack_28f0;
        uStack_b68 = uStack_28e8;
        uStack_b60 = uStack_28e0;
        uStack_b58 = uStack_28d8;
        uStack_b50 = uStack_28d0;
        uStack_b48 = uStack_28c8;
      }
      local_468 = local_2530;
      local_4c0 = local_26c0._0_8_;
      uStack_4b8 = local_26c0._8_8_;
      uStack_4b0 = local_26c0._16_8_;
      uStack_4a8 = local_26c0._24_8_;
      uStack_4a0 = local_26c0._32_8_;
      uStack_498 = local_26c0._40_8_;
      uStack_490 = local_26c0._48_8_;
      uStack_488 = local_26c0._56_8_;
      *local_2530 = local_26c0._0_8_;
      local_2530[1] = local_26c0._8_8_;
      local_2530[2] = local_26c0._16_8_;
      local_2530[3] = local_26c0._24_8_;
      local_2530[4] = local_26c0._32_8_;
      local_2530[5] = local_26c0._40_8_;
      local_2530[6] = local_26c0._48_8_;
      local_2530[7] = local_26c0._56_8_;
      local_4c8 = local_2530 + 8;
      local_540 = local_2700._0_8_;
      uStack_538 = local_2700._8_8_;
      uStack_530 = local_2700._16_8_;
      uStack_528 = local_2700._24_8_;
      uStack_520 = local_2700._32_8_;
      uStack_518 = local_2700._40_8_;
      uStack_510 = local_2700._48_8_;
      uStack_508 = local_2700._56_8_;
      *local_4c8 = local_2700._0_8_;
      local_2530[9] = local_2700._8_8_;
      local_2530[10] = local_2700._16_8_;
      local_2530[0xb] = local_2700._24_8_;
      local_2530[0xc] = local_2700._32_8_;
      local_2530[0xd] = local_2700._40_8_;
      local_2530[0xe] = local_2700._48_8_;
      local_2530[0xf] = local_2700._56_8_;
      local_548 = local_2530 + 0x10;
      local_5c0 = local_2740._0_8_;
      uStack_5b8 = local_2740._8_8_;
      uStack_5b0 = local_2740._16_8_;
      uStack_5a8 = local_2740._24_8_;
      uStack_5a0 = local_2740._32_8_;
      uStack_598 = local_2740._40_8_;
      uStack_590 = local_2740._48_8_;
      uStack_588 = local_2740._56_8_;
      *local_548 = local_2740._0_8_;
      local_2530[0x11] = local_2740._8_8_;
      local_2530[0x12] = local_2740._16_8_;
      local_2530[0x13] = local_2740._24_8_;
      local_2530[0x14] = local_2740._32_8_;
      local_2530[0x15] = local_2740._40_8_;
      local_2530[0x16] = local_2740._48_8_;
      local_2530[0x17] = local_2740._56_8_;
      local_5c8 = local_2530 + 0x18;
      local_640 = local_2780._0_8_;
      uStack_638 = local_2780._8_8_;
      uStack_630 = local_2780._16_8_;
      uStack_628 = local_2780._24_8_;
      uStack_620 = local_2780._32_8_;
      uStack_618 = local_2780._40_8_;
      uStack_610 = local_2780._48_8_;
      uStack_608 = local_2780._56_8_;
      *local_5c8 = local_2780._0_8_;
      local_2530[0x19] = local_2780._8_8_;
      local_2530[0x1a] = local_2780._16_8_;
      local_2530[0x1b] = local_2780._24_8_;
      local_2530[0x1c] = local_2780._32_8_;
      local_2530[0x1d] = local_2780._40_8_;
      local_2530[0x1e] = local_2780._48_8_;
      local_2530[0x1f] = local_2780._56_8_;
      local_648 = local_2530 + 0x20;
      local_6c0 = local_27c0._0_8_;
      uStack_6b8 = local_27c0._8_8_;
      uStack_6b0 = local_27c0._16_8_;
      uStack_6a8 = local_27c0._24_8_;
      uStack_6a0 = local_27c0._32_8_;
      uStack_698 = local_27c0._40_8_;
      uStack_690 = local_27c0._48_8_;
      uStack_688 = local_27c0._56_8_;
      *local_648 = local_27c0._0_8_;
      local_2530[0x21] = local_27c0._8_8_;
      local_2530[0x22] = local_27c0._16_8_;
      local_2530[0x23] = local_27c0._24_8_;
      local_2530[0x24] = local_27c0._32_8_;
      local_2530[0x25] = local_27c0._40_8_;
      local_2530[0x26] = local_27c0._48_8_;
      local_2530[0x27] = local_27c0._56_8_;
      local_6c8 = local_2530 + 0x28;
      local_740 = local_2800._0_8_;
      uStack_738 = local_2800._8_8_;
      uStack_730 = local_2800._16_8_;
      uStack_728 = local_2800._24_8_;
      uStack_720 = local_2800._32_8_;
      uStack_718 = local_2800._40_8_;
      uStack_710 = local_2800._48_8_;
      uStack_708 = local_2800._56_8_;
      *local_6c8 = local_2800._0_8_;
      local_2530[0x29] = local_2800._8_8_;
      local_2530[0x2a] = local_2800._16_8_;
      local_2530[0x2b] = local_2800._24_8_;
      local_2530[0x2c] = local_2800._32_8_;
      local_2530[0x2d] = local_2800._40_8_;
      local_2530[0x2e] = local_2800._48_8_;
      local_2530[0x2f] = local_2800._56_8_;
      local_748 = local_2530 + 0x30;
      local_7c0 = local_2840._0_8_;
      uStack_7b8 = local_2840._8_8_;
      uStack_7b0 = local_2840._16_8_;
      uStack_7a8 = local_2840._24_8_;
      uStack_7a0 = local_2840._32_8_;
      uStack_798 = local_2840._40_8_;
      uStack_790 = local_2840._48_8_;
      uStack_788 = local_2840._56_8_;
      *local_748 = local_2840._0_8_;
      local_2530[0x31] = local_2840._8_8_;
      local_2530[0x32] = local_2840._16_8_;
      local_2530[0x33] = local_2840._24_8_;
      local_2530[0x34] = local_2840._32_8_;
      local_2530[0x35] = local_2840._40_8_;
      local_2530[0x36] = local_2840._48_8_;
      local_2530[0x37] = local_2840._56_8_;
      local_7c8 = local_2530 + 0x38;
      local_840 = local_2880._0_8_;
      uStack_838 = local_2880._8_8_;
      uStack_830 = local_2880._16_8_;
      uStack_828 = local_2880._24_8_;
      uStack_820 = local_2880._32_8_;
      uStack_818 = local_2880._40_8_;
      uStack_810 = local_2880._48_8_;
      uStack_808 = local_2880._56_8_;
      *local_7c8 = local_2880._0_8_;
      local_2530[0x39] = local_2880._8_8_;
      local_2530[0x3a] = local_2880._16_8_;
      local_2530[0x3b] = local_2880._24_8_;
      local_2530[0x3c] = local_2880._32_8_;
      local_2530[0x3d] = local_2880._40_8_;
      local_2530[0x3e] = local_2880._48_8_;
      local_2530[0x3f] = local_2880._56_8_;
      local_2530 = local_2530 + 0x40;
      local_2088 = local_21a0;
      local_2068 = local_21b0;
      local_2650 = local_350;
    }
    for (; local_25cc + 3 < local_2254; local_25cc = local_25cc + 4) {
      local_1f4c = local_25cc / 8 +
                   (int)((long)((ulong)(uint)((int)((long)local_25cc % 8) >> 0x1f) << 0x20 |
                               (long)local_25cc % 8 & 0xffffffffU) / 4);
      local_1f40 = &local_2b50;
      local_1f48 = &local_22b0;
      local_178 = (uint *)((long)local_22b0 + local_2270 * local_1f4c * local_22a0);
      local_160 = &local_2b50;
      local_108 = (long)local_2284 * (long)local_2280 * local_22a0;
      local_1cb0 = &local_2b50;
      local_2190 = &local_2b50;
      local_2b30 = local_2290;
      local_10c = 0x10;
      local_164 = local_2284;
      local_168 = local_2280;
      local_16c = local_227c;
      local_180 = local_22a0;
      local_184 = local_2298;
      local_190 = local_2290;
      local_1f4d = 1;
      local_2b50 = 0;
      local_2b40 = 0;
      local_2b38 = 0;
      local_2b24 = 0;
      local_2b20 = 0;
      local_2b1c = 0;
      local_2b18 = 0;
      local_2b48 = 0;
      local_1d98 = &local_2ba0;
      local_2ec = *(int *)((long)local_2240 + 0x2c);
      local_2f0 = (int)local_2240[6];
      local_2f4 = *(undefined4 *)((long)local_2240 + 0x34);
      local_300 = (undefined1 (*) [64])
                  (*local_2240 + local_2240[8] * (long)local_2528 * local_2240[2]);
      local_308 = local_2240[2];
      local_30c = (undefined4)local_2240[3];
      local_318 = local_2240[4];
      local_2e8 = &local_2ba0;
      local_98 = (long)local_2ec * (long)local_2f0 * local_308;
      local_9c = 0x10;
      local_1da4 = local_2528;
      local_1da5 = 1;
      local_2b10 = 0;
      local_2b28 = 0;
      local_1e08 = &local_2ba0;
      local_2180 = &local_2ba0;
      local_2ba0 = 0;
      local_2b90 = 0;
      local_2b88 = 0;
      local_2b78 = 0;
      local_2b74 = 0;
      local_2b70 = 0;
      local_2b6c = 0;
      local_2b68 = 0;
      local_2b60 = 0;
      local_2b98 = 0;
      local_2ba4 = local_225c * local_2258;
      local_1b50 = local_3158;
      local_2c40 = *local_3158;
      local_2cc0 = *local_3158;
      local_2c80 = *local_3158;
      local_2c00 = *local_3158;
      local_2cc4 = 0;
      local_2b58 = local_300;
      local_2b08 = local_178;
      while( true ) {
        if (local_2ba4 <= local_2cc4) break;
        local_ad0 = local_2b58;
        local_2d40 = *(undefined8 *)*local_2b58;
        uStack_2d38 = *(undefined8 *)(*local_2b58 + 8);
        uStack_2d30 = *(undefined8 *)(*local_2b58 + 0x10);
        uStack_2d28 = *(undefined8 *)(*local_2b58 + 0x18);
        uStack_2d20 = *(undefined8 *)(*local_2b58 + 0x20);
        uStack_2d18 = *(undefined8 *)(*local_2b58 + 0x28);
        uStack_2d10 = *(undefined8 *)(*local_2b58 + 0x30);
        uStack_2d08 = *(undefined8 *)(*local_2b58 + 0x38);
        local_18c4 = *local_2b08;
        local_1940 = vbroadcastss_avx512f(ZEXT416(local_18c4));
        local_2d80 = local_1940._0_8_;
        uStack_2d78 = local_1940._8_8_;
        uStack_2d70 = local_1940._16_8_;
        uStack_2d68 = local_1940._24_8_;
        uStack_2d60 = local_1940._32_8_;
        uStack_2d58 = local_1940._40_8_;
        uStack_2d50 = local_1940._48_8_;
        uStack_2d48 = local_1940._56_8_;
        local_1944 = local_2b08[1];
        local_19c0 = vbroadcastss_avx512f(ZEXT416(local_1944));
        local_2dc0 = local_19c0._0_8_;
        uStack_2db8 = local_19c0._8_8_;
        uStack_2db0 = local_19c0._16_8_;
        uStack_2da8 = local_19c0._24_8_;
        uStack_2da0 = local_19c0._32_8_;
        uStack_2d98 = local_19c0._40_8_;
        uStack_2d90 = local_19c0._48_8_;
        uStack_2d88 = local_19c0._56_8_;
        local_19c4 = local_2b08[2];
        local_1a40 = vbroadcastss_avx512f(ZEXT416(local_19c4));
        local_2e00 = local_1a40._0_8_;
        uStack_2df8 = local_1a40._8_8_;
        uStack_2df0 = local_1a40._16_8_;
        uStack_2de8 = local_1a40._24_8_;
        uStack_2de0 = local_1a40._32_8_;
        uStack_2dd8 = local_1a40._40_8_;
        uStack_2dd0 = local_1a40._48_8_;
        uStack_2dc8 = local_1a40._56_8_;
        local_1a44 = local_2b08[3];
        local_1ac0 = vbroadcastss_avx512f(ZEXT416(local_1a44));
        local_2e40 = local_1ac0._0_8_;
        uStack_2e38 = local_1ac0._8_8_;
        uStack_2e30 = local_1ac0._16_8_;
        uStack_2e28 = local_1ac0._24_8_;
        uStack_2e20 = local_1ac0._32_8_;
        uStack_2e18 = local_1ac0._40_8_;
        uStack_2e10 = local_1ac0._48_8_;
        uStack_2e08 = local_1ac0._56_8_;
        local_1140 = local_1940._0_8_;
        uStack_1138 = local_1940._8_8_;
        uStack_1130 = local_1940._16_8_;
        uStack_1128 = local_1940._24_8_;
        uStack_1120 = local_1940._32_8_;
        uStack_1118 = local_1940._40_8_;
        uStack_1110 = local_1940._48_8_;
        uStack_1108 = local_1940._56_8_;
        local_11c0 = local_2c00._0_8_;
        uStack_11b8 = local_2c00._8_8_;
        uStack_11b0 = local_2c00._16_8_;
        uStack_11a8 = local_2c00._24_8_;
        uStack_11a0 = local_2c00._32_8_;
        uStack_1198 = local_2c00._40_8_;
        uStack_1190 = local_2c00._48_8_;
        uStack_1188 = local_2c00._56_8_;
        local_2c00 = vfmadd213ps_avx512f(*local_2b58,local_1940,local_2c00);
        local_1200 = local_19c0._0_8_;
        uStack_11f8 = local_19c0._8_8_;
        uStack_11f0 = local_19c0._16_8_;
        uStack_11e8 = local_19c0._24_8_;
        uStack_11e0 = local_19c0._32_8_;
        uStack_11d8 = local_19c0._40_8_;
        uStack_11d0 = local_19c0._48_8_;
        uStack_11c8 = local_19c0._56_8_;
        local_1280 = local_2c40._0_8_;
        uStack_1278 = local_2c40._8_8_;
        uStack_1270 = local_2c40._16_8_;
        uStack_1268 = local_2c40._24_8_;
        uStack_1260 = local_2c40._32_8_;
        uStack_1258 = local_2c40._40_8_;
        uStack_1250 = local_2c40._48_8_;
        uStack_1248 = local_2c40._56_8_;
        local_2c40 = vfmadd213ps_avx512f(*local_2b58,local_19c0,local_2c40);
        local_12c0 = local_1a40._0_8_;
        uStack_12b8 = local_1a40._8_8_;
        uStack_12b0 = local_1a40._16_8_;
        uStack_12a8 = local_1a40._24_8_;
        uStack_12a0 = local_1a40._32_8_;
        uStack_1298 = local_1a40._40_8_;
        uStack_1290 = local_1a40._48_8_;
        uStack_1288 = local_1a40._56_8_;
        local_1340 = local_2c80._0_8_;
        uStack_1338 = local_2c80._8_8_;
        uStack_1330 = local_2c80._16_8_;
        uStack_1328 = local_2c80._24_8_;
        uStack_1320 = local_2c80._32_8_;
        uStack_1318 = local_2c80._40_8_;
        uStack_1310 = local_2c80._48_8_;
        uStack_1308 = local_2c80._56_8_;
        local_2c80 = vfmadd213ps_avx512f(*local_2b58,local_1a40,local_2c80);
        local_1380 = local_1ac0._0_8_;
        uStack_1378 = local_1ac0._8_8_;
        uStack_1370 = local_1ac0._16_8_;
        uStack_1368 = local_1ac0._24_8_;
        uStack_1360 = local_1ac0._32_8_;
        uStack_1358 = local_1ac0._40_8_;
        uStack_1350 = local_1ac0._48_8_;
        uStack_1348 = local_1ac0._56_8_;
        local_1400 = local_2cc0._0_8_;
        uStack_13f8 = local_2cc0._8_8_;
        uStack_13f0 = local_2cc0._16_8_;
        uStack_13e8 = local_2cc0._24_8_;
        uStack_13e0 = local_2cc0._32_8_;
        uStack_13d8 = local_2cc0._40_8_;
        uStack_13d0 = local_2cc0._48_8_;
        uStack_13c8 = local_2cc0._56_8_;
        local_2cc0 = vfmadd213ps_avx512f(*local_2b58,local_1ac0,local_2cc0);
        local_2b08 = local_2b08 + 4;
        local_2b58 = local_2b58 + 1;
        local_2cc4 = local_2cc4 + 1;
        local_13c0 = local_2d40;
        uStack_13b8 = uStack_2d38;
        uStack_13b0 = uStack_2d30;
        uStack_13a8 = uStack_2d28;
        uStack_13a0 = uStack_2d20;
        uStack_1398 = uStack_2d18;
        uStack_1390 = uStack_2d10;
        uStack_1388 = uStack_2d08;
        local_1300 = local_2d40;
        uStack_12f8 = uStack_2d38;
        uStack_12f0 = uStack_2d30;
        uStack_12e8 = uStack_2d28;
        uStack_12e0 = uStack_2d20;
        uStack_12d8 = uStack_2d18;
        uStack_12d0 = uStack_2d10;
        uStack_12c8 = uStack_2d08;
        local_1240 = local_2d40;
        uStack_1238 = uStack_2d38;
        uStack_1230 = uStack_2d30;
        uStack_1228 = uStack_2d28;
        uStack_1220 = uStack_2d20;
        uStack_1218 = uStack_2d18;
        uStack_1210 = uStack_2d10;
        uStack_1208 = uStack_2d08;
        local_1180 = local_2d40;
        uStack_1178 = uStack_2d38;
        uStack_1170 = uStack_2d30;
        uStack_1168 = uStack_2d28;
        uStack_1160 = uStack_2d20;
        uStack_1158 = uStack_2d18;
        uStack_1150 = uStack_2d10;
        uStack_1148 = uStack_2d08;
      }
      local_848 = local_2530;
      local_8c0 = local_2c00._0_8_;
      uStack_8b8 = local_2c00._8_8_;
      uStack_8b0 = local_2c00._16_8_;
      uStack_8a8 = local_2c00._24_8_;
      uStack_8a0 = local_2c00._32_8_;
      uStack_898 = local_2c00._40_8_;
      uStack_890 = local_2c00._48_8_;
      uStack_888 = local_2c00._56_8_;
      *local_2530 = local_2c00._0_8_;
      local_2530[1] = local_2c00._8_8_;
      local_2530[2] = local_2c00._16_8_;
      local_2530[3] = local_2c00._24_8_;
      local_2530[4] = local_2c00._32_8_;
      local_2530[5] = local_2c00._40_8_;
      local_2530[6] = local_2c00._48_8_;
      local_2530[7] = local_2c00._56_8_;
      local_8c8 = local_2530 + 8;
      local_940 = local_2c40._0_8_;
      uStack_938 = local_2c40._8_8_;
      uStack_930 = local_2c40._16_8_;
      uStack_928 = local_2c40._24_8_;
      uStack_920 = local_2c40._32_8_;
      uStack_918 = local_2c40._40_8_;
      uStack_910 = local_2c40._48_8_;
      uStack_908 = local_2c40._56_8_;
      *local_8c8 = local_2c40._0_8_;
      local_2530[9] = local_2c40._8_8_;
      local_2530[10] = local_2c40._16_8_;
      local_2530[0xb] = local_2c40._24_8_;
      local_2530[0xc] = local_2c40._32_8_;
      local_2530[0xd] = local_2c40._40_8_;
      local_2530[0xe] = local_2c40._48_8_;
      local_2530[0xf] = local_2c40._56_8_;
      local_948 = local_2530 + 0x10;
      local_9c0 = local_2c80._0_8_;
      uStack_9b8 = local_2c80._8_8_;
      uStack_9b0 = local_2c80._16_8_;
      uStack_9a8 = local_2c80._24_8_;
      uStack_9a0 = local_2c80._32_8_;
      uStack_998 = local_2c80._40_8_;
      uStack_990 = local_2c80._48_8_;
      uStack_988 = local_2c80._56_8_;
      *local_948 = local_2c80._0_8_;
      local_2530[0x11] = local_2c80._8_8_;
      local_2530[0x12] = local_2c80._16_8_;
      local_2530[0x13] = local_2c80._24_8_;
      local_2530[0x14] = local_2c80._32_8_;
      local_2530[0x15] = local_2c80._40_8_;
      local_2530[0x16] = local_2c80._48_8_;
      local_2530[0x17] = local_2c80._56_8_;
      local_9c8 = local_2530 + 0x18;
      local_a40 = local_2cc0._0_8_;
      uStack_a38 = local_2cc0._8_8_;
      uStack_a30 = local_2cc0._16_8_;
      uStack_a28 = local_2cc0._24_8_;
      uStack_a20 = local_2cc0._32_8_;
      uStack_a18 = local_2cc0._40_8_;
      uStack_a10 = local_2cc0._48_8_;
      uStack_a08 = local_2cc0._56_8_;
      *local_9c8 = local_2cc0._0_8_;
      local_2530[0x19] = local_2cc0._8_8_;
      local_2530[0x1a] = local_2cc0._16_8_;
      local_2530[0x1b] = local_2cc0._24_8_;
      local_2530[0x1c] = local_2cc0._32_8_;
      local_2530[0x1d] = local_2cc0._40_8_;
      local_2530[0x1e] = local_2cc0._48_8_;
      local_2530[0x1f] = local_2cc0._56_8_;
      local_2530 = local_2530 + 0x20;
      local_20c8 = local_2180;
      local_20a8 = local_2190;
      local_2b80 = local_318;
    }
    for (; local_25cc < local_2254; local_25cc = local_25cc + 1) {
      local_1f7c = local_25cc / 8 +
                   (int)((long)((ulong)(uint)((int)((long)local_25cc % 8) >> 0x1f) << 0x20 |
                               (long)local_25cc % 8 & 0xffffffffU) / 4) + local_25cc % 4;
      local_1f70 = &local_2e90;
      local_1f78 = &local_22b0;
      local_140 = (uint *)((long)local_22b0 + local_2270 * local_1f7c * local_22a0);
      local_128 = &local_2e90;
      local_118 = (long)local_2284 * (long)local_2280 * local_22a0;
      local_1cb8 = &local_2e90;
      local_2170 = &local_2e90;
      local_1dc8 = &local_2ee0;
      local_2b4 = *(int *)((long)local_2240 + 0x2c);
      local_2b8 = (int)local_2240[6];
      local_2bc = *(undefined4 *)((long)local_2240 + 0x34);
      local_2c8 = (undefined1 (*) [64])
                  (*local_2240 + local_2240[8] * (long)local_2528 * local_2240[2]);
      local_2d0 = local_2240[2];
      local_2d4 = (undefined4)local_2240[3];
      local_2e0 = local_2240[4];
      local_2b0 = &local_2ee0;
      local_a8 = (long)local_2b4 * (long)local_2b8 * local_2d0;
      local_ac = 0x10;
      local_11c = 0x10;
      local_12c = local_2284;
      local_130 = local_2280;
      local_134 = local_227c;
      local_148 = local_22a0;
      local_14c = local_2298;
      local_158 = local_2290;
      local_1dd4 = local_2528;
      local_1dd5 = 1;
      local_1e10 = &local_2ee0;
      local_2160 = &local_2ee0;
      local_2e58 = 0;
      local_2e5c = 0;
      local_2e60 = 0;
      local_2e64 = 0;
      local_2e70 = local_2290;
      local_2e78 = 0;
      local_2e80 = 0;
      local_2e88 = 0;
      local_2e90 = 0;
      local_1f7d = 1;
      local_2e50 = 0;
      local_2e68 = 0;
      local_2ee0 = 0;
      local_2ed0 = 0;
      local_2ec8 = 0;
      local_2eb8 = 0;
      local_2eb4 = 0;
      local_2eb0 = 0;
      local_2eac = 0;
      local_2ea8 = 0;
      local_2ea0 = 0;
      local_2ed8 = 0;
      local_1b58 = local_3158;
      local_2f40 = *local_3158;
      local_2f44 = 0;
      local_2e98 = local_2c8;
      local_2e48 = local_140;
      while( true ) {
        if (local_225c * local_2258 <= local_2f44) break;
        local_ad8 = local_2e98;
        local_1440 = *(undefined8 *)*local_2e98;
        uStack_1438 = *(undefined8 *)(*local_2e98 + 8);
        uStack_1430 = *(undefined8 *)(*local_2e98 + 0x10);
        uStack_1428 = *(undefined8 *)(*local_2e98 + 0x18);
        uStack_1420 = *(undefined8 *)(*local_2e98 + 0x20);
        uStack_1418 = *(undefined8 *)(*local_2e98 + 0x28);
        uStack_1410 = *(undefined8 *)(*local_2e98 + 0x30);
        uStack_1408 = *(undefined8 *)(*local_2e98 + 0x38);
        local_1ac4 = *local_2e48;
        local_1b40 = vbroadcastss_avx512f(ZEXT416(local_1ac4));
        local_1480 = local_1b40._0_8_;
        uStack_1478 = local_1b40._8_8_;
        uStack_1470 = local_1b40._16_8_;
        uStack_1468 = local_1b40._24_8_;
        uStack_1460 = local_1b40._32_8_;
        uStack_1458 = local_1b40._40_8_;
        uStack_1450 = local_1b40._48_8_;
        uStack_1448 = local_1b40._56_8_;
        local_14c0 = local_2f40._0_8_;
        uStack_14b8 = local_2f40._8_8_;
        uStack_14b0 = local_2f40._16_8_;
        uStack_14a8 = local_2f40._24_8_;
        uStack_14a0 = local_2f40._32_8_;
        uStack_1498 = local_2f40._40_8_;
        uStack_1490 = local_2f40._48_8_;
        uStack_1488 = local_2f40._56_8_;
        local_2f40 = vfmadd213ps_avx512f(local_1b40,*local_2e98,local_2f40);
        local_2e48 = local_2e48 + 1;
        local_2e98 = local_2e98 + 1;
        local_2f44 = local_2f44 + 1;
      }
      local_a48 = local_2530;
      local_ac0 = local_2f40._0_8_;
      uStack_ab8 = local_2f40._8_8_;
      uStack_ab0 = local_2f40._16_8_;
      uStack_aa8 = local_2f40._24_8_;
      uStack_aa0 = local_2f40._32_8_;
      uStack_a98 = local_2f40._40_8_;
      uStack_a90 = local_2f40._48_8_;
      uStack_a88 = local_2f40._56_8_;
      *local_2530 = local_2f40._0_8_;
      local_2530[1] = local_2f40._8_8_;
      local_2530[2] = local_2f40._16_8_;
      local_2530[3] = local_2f40._24_8_;
      local_2530[4] = local_2f40._32_8_;
      local_2530[5] = local_2f40._40_8_;
      local_2530[6] = local_2f40._48_8_;
      local_2530[7] = local_2f40._56_8_;
      local_2530 = local_2530 + 8;
      local_2108 = local_2160;
      local_20e8 = local_2170;
      local_2ec0 = local_2e0;
    }
  }
  ppvVar2 = &local_22b0;
  if (local_22a8 != (int *)0x0) {
    local_212c = 0xffffffff;
    LOCK();
    local_2130 = *local_22a8;
    *local_22a8 = *local_22a8 + -1;
    UNLOCK();
    if (local_2130 == 1) {
      local_2150 = ppvVar2;
      local_2128 = ppvVar2;
      if (local_2290 == (long *)0x0) {
        local_1b68 = local_22b0;
        if (local_22b0 != (void *)0x0) {
          free(local_22b0);
        }
      }
      else {
        (**(code **)(*local_2290 + 0x18))(local_2290,local_22b0);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return;
}

Assistant:

static void im2col_sgemm_pack1to16_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u, 1, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u, 1, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _r0 = _mm256_loadu_ps(img0);
                    _mm256_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    _mm_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 4;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    img0 += size;
                    tmpptr += 1;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 16 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr0);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);

                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 16;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 16 * 2, _sum2);
            _mm512_store_ps(outptr0 + 16 * 3, _sum3);
            _mm512_store_ps(outptr0 + 16 * 4, _sum4);
            _mm512_store_ps(outptr0 + 16 * 5, _sum5);
            _mm512_store_ps(outptr0 + 16 * 6, _sum6);
            _mm512_store_ps(outptr0 + 16 * 7, _sum7);
            outptr0 += 128;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr0);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);

                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 16;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 32, _sum2);
            _mm512_store_ps(outptr0 + 48, _sum3);
            outptr0 += 64;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m512 _sum = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr0);
                __m512 _val = _mm512_set1_ps(tmpptr[0]);
                _sum = _mm512_fmadd_ps(_w0, _val, _sum);

                tmpptr += 1;
                kptr0 += 16;
            }

            _mm512_store_ps(outptr0, _sum);
            outptr0 += 16;
        }
    }
}